

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::MILSpec::Program::Program(Program *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Program_00416d90;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->functions_).arena_ = (Arena *)0x0;
  *(undefined8 *)((long)&(this->functions_).arena_ + 4) = 0;
  *(undefined8 *)((long)&(this->functions_).map_.arena_ + 4) = 0;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function>
  ::Init(&(this->functions_).map_);
  (this->functions_).map_.default_enum_value_ = 0;
  (this->attributes_).arena_ = (Arena *)0x0;
  (this->attributes_).map_.arena_ = (Arena *)0x0;
  (this->attributes_).map_.default_enum_value_ = 0;
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::Init(&(this->attributes_).map_);
  (this->attributes_).map_.default_enum_value_ = 0;
  if (this != (Program *)&_Program_default_instance_) {
    protobuf_MIL_2eproto::InitDefaults();
  }
  (this->docstring_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->version_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

Program::Program()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_MIL_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.MILSpec.Program)
}